

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Mutex.cpp
# Opt level: O0

bool __thiscall axl::sys::psx::Mutex::lock(Mutex *this,uint_t timeout)

{
  int in_ESI;
  pthread_mutex_t *in_RDI;
  timespec ts;
  int result;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  uint in_stack_ffffffffffffffbc;
  ErrorRef *in_stack_ffffffffffffffc0;
  timespec local_28;
  int local_18;
  byte local_1;
  
  if (in_ESI == -1) {
    local_18 = pthread_mutex_lock(in_RDI);
  }
  else if (in_ESI == 0) {
    local_18 = pthread_mutex_trylock(in_RDI);
  }
  else {
    memset(&local_28,0,0x10);
    getAbsTimespecFromTimeout
              ((uint_t)((ulong)in_RDI >> 0x20),
               (timespec *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
    local_18 = pthread_mutex_timedlock(in_RDI,&local_28);
  }
  in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
  if (local_18 == 0) {
    local_1 = true;
  }
  else {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffbc = 0x1000000;
    local_1 = err::fail((ErrorRef *)0x140dba);
  }
  if ((in_stack_ffffffffffffffbc & 0x1000000) != 0) {
    err::ErrorRef::~ErrorRef((ErrorRef *)0x140de7);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool
Mutex::lock(uint_t timeout) {
	int result;

	switch (timeout) {
	case 0:
		result = ::pthread_mutex_trylock(&m_mutex);
		break;

	case -1:
		result = ::pthread_mutex_lock(&m_mutex);
		break;

	default:
		timespec ts = { 0 };
		sys::getAbsTimespecFromTimeout(timeout, &ts);
		result = ::pthread_mutex_timedlock(&m_mutex, &ts);
	}

	return result == 0 ? true : err::fail(result);
}